

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

bool mkvmuxer::WriteEbmlDateElement(IMkvWriter *writer,uint64 type,int64 value)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  undefined8 in_RAX;
  int32 bit_count;
  long lVar4;
  bool bVar5;
  uint8 b_1;
  uint8 b;
  undefined8 uStack_28;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  uStack_28 = in_RAX;
  iVar2 = WriteID(writer,type);
  if (iVar2 == 0) {
    uStack_28 = CONCAT17(0x88,(undefined7)uStack_28);
    iVar3 = (**writer->_vptr_IMkvWriter)(writer,(long)&uStack_28 + 7,1);
    if (-1 < iVar3) {
      lVar4 = 0x38;
      do {
        uStack_28._0_7_ = CONCAT16((char)(value >> ((byte)lVar4 & 0x3f)),(undefined6)uStack_28);
        iVar3 = (**writer->_vptr_IMkvWriter)(writer,(long)&uStack_28 + 6,1);
        bVar1 = iVar3 >= 0;
        if (iVar3 < 0) {
          return bVar1;
        }
        bVar5 = lVar4 != 0;
        lVar4 = lVar4 + -8;
      } while (bVar5);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool WriteEbmlDateElement(IMkvWriter* writer, uint64 type, int64 value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, kDateElementSize))
    return false;

  if (SerializeInt(writer, value, kDateElementSize))
    return false;

  return true;
}